

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expression_heuristics.cpp
# Opt level: O2

void __thiscall
duckdb::ExpressionHeuristics::ReorderExpressions
          (ExpressionHeuristics *this,
          vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
          *expressions)

{
  _Head_base<0UL,_duckdb::Expression_*,_false> _Var1;
  long lVar2;
  pointer __last;
  pointer pEVar3;
  int iVar4;
  reference pvVar5;
  pointer pEVar6;
  pointer pEVar7;
  type expr;
  idx_t iVar8;
  ulong uVar9;
  pointer __result;
  pointer pEVar10;
  __uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_> *this_00;
  _Tp_alloc_type *__alloc;
  ulong uVar11;
  _Tp_alloc_type *p_Var12;
  _Vector_base<ExpressionCosts,_std::allocator<ExpressionCosts>_> *p_Var13;
  __normal_iterator<ExpressionCosts_*,_std::vector<ExpressionCosts,_std::allocator<ExpressionCosts>_>_>
  __i;
  size_type __n;
  _Vector_base<ExpressionCosts,_std::allocator<ExpressionCosts>_> *p_Var14;
  _Vector_base<ExpressionCosts,_std::allocator<ExpressionCosts>_> *this_01;
  ulong uVar15;
  idx_t i;
  long lVar16;
  vector<ExpressionCosts,_std::allocator<ExpressionCosts>_> local_68;
  Expression *local_48;
  pointer local_40;
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
  *local_38;
  
  p_Var14 = (_Vector_base<ExpressionCosts,_std::allocator<ExpressionCosts>_> *)0x0;
  p_Var13 = (_Vector_base<ExpressionCosts,_std::allocator<ExpressionCosts>_> *)expressions;
  do {
    p_Var12 = (_Tp_alloc_type *)
              (expressions->
              super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
              ).
              super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    __alloc = (_Tp_alloc_type *)
              (expressions->
              super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
              ).
              super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    this_01 = (_Vector_base<ExpressionCosts,_std::allocator<ExpressionCosts>_> *)
              ((long)__alloc - (long)p_Var12 >> 3);
    if (this_01 <= p_Var14) {
      local_68.super__Vector_base<ExpressionCosts,_std::allocator<ExpressionCosts>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_68.super__Vector_base<ExpressionCosts,_std::allocator<ExpressionCosts>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_68.super__Vector_base<ExpressionCosts,_std::allocator<ExpressionCosts>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      if ((ulong)this_01 >> 0x3b != 0) {
        ::std::__throw_length_error("vector::reserve");
      }
      if (__alloc != p_Var12) {
        pEVar7 = ::std::_Vector_base<ExpressionCosts,_std::allocator<ExpressionCosts>_>::_M_allocate
                           (this_01,(size_t)p_Var13);
        ::std::vector<ExpressionCosts,_std::allocator<ExpressionCosts>_>::_S_relocate
                  ((pointer)0x0,(pointer)0x0,pEVar7,__alloc);
        local_68.super__Vector_base<ExpressionCosts,_std::allocator<ExpressionCosts>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = pEVar7 + (long)this_01;
        local_68.super__Vector_base<ExpressionCosts,_std::allocator<ExpressionCosts>_>._M_impl.
        super__Vector_impl_data._M_finish = pEVar7;
      }
      uVar15 = 0;
      pEVar7 = local_68.super__Vector_base<ExpressionCosts,_std::allocator<ExpressionCosts>_>.
               _M_impl.super__Vector_impl_data._M_end_of_storage;
      __result = local_68.super__Vector_base<ExpressionCosts,_std::allocator<ExpressionCosts>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
      local_68.super__Vector_base<ExpressionCosts,_std::allocator<ExpressionCosts>_>._M_impl.
      super__Vector_impl_data._M_start =
           local_68.super__Vector_base<ExpressionCosts,_std::allocator<ExpressionCosts>_>._M_impl.
           super__Vector_impl_data._M_finish;
      local_38 = expressions;
      do {
        __last = local_68.super__Vector_base<ExpressionCosts,_std::allocator<ExpressionCosts>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
        if ((ulong)((long)(expressions->
                          super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                          ).
                          super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)(expressions->
                          super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                          ).
                          super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                          ._M_impl.super__Vector_impl_data._M_start >> 3) <= uVar15) {
          uVar15 = (long)local_68.
                         super__Vector_base<ExpressionCosts,_std::allocator<ExpressionCosts>_>.
                         _M_impl.super__Vector_impl_data._M_finish - (long)__result >> 4;
          lVar16 = (long)local_68.
                         super__Vector_base<ExpressionCosts,_std::allocator<ExpressionCosts>_>.
                         _M_impl.super__Vector_impl_data._M_finish - (long)__result;
          local_68.super__Vector_base<ExpressionCosts,_std::allocator<ExpressionCosts>_>._M_impl.
          super__Vector_impl_data._M_start = __result;
          local_68.super__Vector_base<ExpressionCosts,_std::allocator<ExpressionCosts>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = pEVar7;
          if (local_68.super__Vector_base<ExpressionCosts,_std::allocator<ExpressionCosts>_>._M_impl
              .super__Vector_impl_data._M_finish != __result) {
            lVar2 = 0x3f;
            if (uVar15 != 0) {
              for (; uVar15 >> lVar2 == 0; lVar2 = lVar2 + -1) {
              }
            }
            ::std::
            __introsort_loop<__gnu_cxx::__normal_iterator<duckdb::ExpressionHeuristics::ReorderExpressions(duckdb::vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,true>&)::ExpressionCosts*,std::vector<duckdb::ExpressionHeuristics::ReorderExpressions(duckdb::vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,true>&)::ExpressionCosts,std::allocator<duckdb::ExpressionHeuristics::ReorderExpressions(duckdb::vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,true>&)::ExpressionCosts>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
                      (__result,local_68.
                                super__Vector_base<ExpressionCosts,_std::allocator<ExpressionCosts>_>
                                ._M_impl.super__Vector_impl_data._M_finish,
                       ((uint)lVar2 ^ 0x3f) * 2 ^ 0x7e);
            if (lVar16 < 0x101) {
              ::std::
              __insertion_sort<__gnu_cxx::__normal_iterator<duckdb::ExpressionHeuristics::ReorderExpressions(duckdb::vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,true>&)::ExpressionCosts*,std::vector<duckdb::ExpressionHeuristics::ReorderExpressions(duckdb::vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,true>&)::ExpressionCosts,std::allocator<duckdb::ExpressionHeuristics::ReorderExpressions(duckdb::vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,true>&)::ExpressionCosts>>>,__gnu_cxx::__ops::_Iter_less_iter>
                        (__result,__last);
            }
            else {
              pEVar7 = __result + 0x10;
              ::std::
              __insertion_sort<__gnu_cxx::__normal_iterator<duckdb::ExpressionHeuristics::ReorderExpressions(duckdb::vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,true>&)::ExpressionCosts*,std::vector<duckdb::ExpressionHeuristics::ReorderExpressions(duckdb::vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,true>&)::ExpressionCosts,std::allocator<duckdb::ExpressionHeuristics::ReorderExpressions(duckdb::vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,true>&)::ExpressionCosts>>>,__gnu_cxx::__ops::_Iter_less_iter>
                        (__result,pEVar7);
              for (; pEVar7 != __last; pEVar7 = pEVar7 + 1) {
                ::std::
                __unguarded_linear_insert<__gnu_cxx::__normal_iterator<duckdb::ExpressionHeuristics::ReorderExpressions(duckdb::vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,true>&)::ExpressionCosts*,std::vector<duckdb::ExpressionHeuristics::ReorderExpressions(duckdb::vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,true>&)::ExpressionCosts,std::allocator<duckdb::ExpressionHeuristics::ReorderExpressions(duckdb::vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,true>&)::ExpressionCosts>>>,__gnu_cxx::__ops::_Val_less_iter>
                          (pEVar7);
              }
            }
          }
          for (__n = 0; uVar15 != __n; __n = __n + 1) {
            this_00 = (__uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>
                       *)vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                         ::get<true>(expressions,__n);
            ::std::__uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>::
            operator=(this_00,(__uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>
                               *)__result);
            __result = __result + 1;
          }
          ::std::vector<ExpressionCosts,_std::allocator<ExpressionCosts>_>::~vector(&local_68);
          return;
        }
        pvVar5 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                 ::get<true>(expressions,uVar15);
        expr = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
               operator*(pvVar5);
        iVar8 = Cost(expr);
        pvVar5 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                 ::get<true>(expressions,uVar15);
        _Var1._M_head_impl =
             (pvVar5->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>
             )._M_t.
             super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>.
             _M_t.
             super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
             super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
        (pvVar5->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>).
        _M_t.super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>.
        _M_t.super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
        super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl = (Expression *)0x0;
        if (__last == pEVar7) {
          lVar16 = (long)__last - (long)__result;
          local_48 = _Var1._M_head_impl;
          if (lVar16 == 0x7ffffffffffffff0) {
            local_68.super__Vector_base<ExpressionCosts,_std::allocator<ExpressionCosts>_>._M_impl.
            super__Vector_impl_data._M_start = __result;
            local_68.super__Vector_base<ExpressionCosts,_std::allocator<ExpressionCosts>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage = pEVar7;
            ::std::__throw_length_error("vector::_M_realloc_insert");
          }
          uVar9 = lVar16 >> 4;
          uVar11 = 1;
          if (__last != __result) {
            uVar11 = uVar9;
          }
          p_Var13 = (_Vector_base<ExpressionCosts,_std::allocator<ExpressionCosts>_> *)
                    (uVar11 + uVar9);
          if ((_Vector_base<ExpressionCosts,_std::allocator<ExpressionCosts>_> *)0x7fffffffffffffe <
              p_Var13) {
            p_Var13 = (_Vector_base<ExpressionCosts,_std::allocator<ExpressionCosts>_> *)
                      0x7ffffffffffffff;
          }
          p_Var12 = (_Tp_alloc_type *)(uVar11 + uVar9);
          p_Var14 = (_Vector_base<ExpressionCosts,_std::allocator<ExpressionCosts>_> *)
                    0x7ffffffffffffff;
          if (!CARRY8(uVar11,uVar9)) {
            p_Var14 = p_Var13;
          }
          local_40 = __result;
          __result = ::std::_Vector_base<ExpressionCosts,_std::allocator<ExpressionCosts>_>::
                     _M_allocate(p_Var14,0x7ffffffffffffff);
          pEVar3 = local_40;
          *(Expression **)((long)__result + lVar16) = local_48;
          *(idx_t *)((long)__result + lVar16 + 8) = iVar8;
          pEVar10 = ::std::vector<ExpressionCosts,_std::allocator<ExpressionCosts>_>::_S_relocate
                              (local_40,__last,__result,p_Var12);
          pEVar10 = ::std::vector<ExpressionCosts,_std::allocator<ExpressionCosts>_>::_S_relocate
                              (__last,__last,pEVar10 + 1,p_Var12);
          if (pEVar3 != (pointer)0x0) {
            operator_delete(pEVar3);
          }
          pEVar7 = __result + (long)p_Var14;
          expressions = local_38;
          local_68.super__Vector_base<ExpressionCosts,_std::allocator<ExpressionCosts>_>._M_impl.
          super__Vector_impl_data._M_finish = pEVar10;
        }
        else {
          (__last->expr).
          super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
          super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
          super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
          super__Head_base<0UL,_duckdb::Expression_*,_false> =
               (_Head_base<0UL,_duckdb::Expression_*,_false>)_Var1._M_head_impl;
          __last->cost = iVar8;
          local_68.super__Vector_base<ExpressionCosts,_std::allocator<ExpressionCosts>_>._M_impl.
          super__Vector_impl_data._M_finish = __last + 1;
        }
        uVar15 = uVar15 + 1;
      } while( true );
    }
    p_Var13 = p_Var14;
    pvVar5 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
             ::get<true>(expressions,(size_type)p_Var14);
    pEVar6 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
             operator->(pvVar5);
    iVar4 = (*(pEVar6->super_BaseExpression)._vptr_BaseExpression[0x10])(pEVar6);
    p_Var14 = (_Vector_base<ExpressionCosts,_std::allocator<ExpressionCosts>_> *)
              ((long)&(((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                         *)&p_Var14->_M_impl)->
                      super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                      )._M_impl.super__Vector_impl_data._M_start + 1);
  } while ((char)iVar4 == '\0');
  return;
}

Assistant:

void ExpressionHeuristics::ReorderExpressions(vector<unique_ptr<Expression>> &expressions) {
	struct ExpressionCosts {
		unique_ptr<Expression> expr;
		idx_t cost;

		bool operator==(const ExpressionCosts &p) const {
			return cost == p.cost;
		}
		bool operator<(const ExpressionCosts &p) const {
			return cost < p.cost;
		}
	};

	for (idx_t i = 0; i < expressions.size(); i++) {
		if (expressions[i]->CanThrow()) {
			// do not allow reordering if an expression can throw
			return;
		}
	}

	vector<ExpressionCosts> expression_costs;
	expression_costs.reserve(expressions.size());
	// iterate expressions, get cost for each one
	for (idx_t i = 0; i < expressions.size(); i++) {
		idx_t cost = Cost(*expressions[i]);
		expression_costs.push_back({std::move(expressions[i]), cost});
	}

	// sort by cost and put back in place
	sort(expression_costs.begin(), expression_costs.end());
	for (idx_t i = 0; i < expression_costs.size(); i++) {
		expressions[i] = std::move(expression_costs[i].expr);
	}
}